

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

ColMatrix * __thiscall fizplex::Base::get_inverse(ColMatrix *__return_storage_ptr__,Base *this)

{
  pointer pEVar1;
  pointer pNVar2;
  unsigned_long *puVar3;
  SVector *pSVar4;
  ulong uVar5;
  Nonzero *n;
  pointer pNVar6;
  ulong uVar7;
  size_t i;
  ulong i_00;
  
  ColMatrix::identity(__return_storage_ptr__,this->m);
  uVar5 = this->m;
  for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
    for (i_00 = 0; i_00 < uVar5; i_00 = i_00 + 1) {
      pEVar1 = (this->etms).
               super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar4 = ColMatrix::column(__return_storage_ptr__,i_00);
      apply_etm(this,pEVar1 + uVar7,pSVar4);
      uVar5 = this->m;
    }
  }
  for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
    pSVar4 = ColMatrix::column(__return_storage_ptr__,uVar7);
    pNVar2 = (pSVar4->values).
             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    for (pNVar6 = (pSVar4->values).
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar2; pNVar6 = pNVar6 + 1)
    {
      pNVar6->index = puVar3[pNVar6->index];
    }
    uVar5 = this->m;
  }
  return __return_storage_ptr__;
}

Assistant:

ColMatrix Base::get_inverse() {
  auto inv = ColMatrix::identity(m);
  for (size_t ind = 0; ind < m; ++ind) {
    for (size_t i = 0; i < m; ++i)
      apply_etm(etms[ind], inv.column(i));
  }

  for (size_t col = 0; col < m; ++col) {
    for (auto &n : inv.column(col))
      n.index = row_ordering[n.index];
  }
  return inv;
}